

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

void cleanup_quest(void)

{
  quest *pqVar1;
  quest_artifact *pqVar2;
  quest_place *pqVar3;
  quest_place *next_place;
  quest_place *place;
  quest_artifact *next_art;
  quest_artifact *arts;
  quest *next;
  quest *quest;
  
  next = quests;
  while (next != (quest *)0x0) {
    next_art = next->arts;
    next_place = next->place;
    pqVar1 = next->next;
    string_free(next->name);
    while (next_art != (quest_artifact *)0x0) {
      pqVar2 = next_art->next;
      mem_free(next_art);
      next_art = pqVar2;
    }
    while (next_place != (quest_place *)0x0) {
      pqVar3 = next_place->next;
      mem_free(next_place);
      next_place = pqVar3;
    }
    mem_free(next);
    next = pqVar1;
  }
  return;
}

Assistant:

static void cleanup_quest(void)
{
	struct quest *quest = quests, *next;

	while (quest) {
		struct quest_artifact *arts = quest->arts, *next_art;
		struct quest_place *place = quest->place, *next_place;
		next = quest->next;
		string_free(quest->name);
		while (arts) {
			next_art = arts->next;
			mem_free(arts);
			arts = next_art;
		}
		while (place) {
			next_place = place->next;
			mem_free(place);
			place = next_place;
		}
		mem_free(quest);
		quest = next;
	}
}